

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O2

int __thiscall ccel::udev::virtual_keyboard_handler::close(virtual_keyboard_handler *this,int __fd)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = (*(this->super_base_handler)._vptr_base_handler[4])
                    (this,CONCAT44(in_register_00000034,__fd));
  if ((char)iVar1 != '\0') {
    iVar1 = ioctl(this->_fd,0x5502);
    this->_open = false;
    return iVar1;
  }
  return 0;
}

Assistant:

int virtual_keyboard_handler::close() {
  if (this->opened()) {
    int _status = ioctl(_fd, UI_DEV_DESTROY);
    _open = false;
    return _status;
  } else
    return 0;
}